

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

bool AreMembersAligned(ExternTypeInfo *lType,ExternTypeInfo *exTypes,ExternMemberInfo *exTypeExtra)

{
  uint uVar1;
  TypeCategory TVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar5 = (ulong)(lType->field_8).arrSize;
  if (uVar5 == 0) {
    bVar4 = true;
  }
  else {
    uVar6 = (lType->field_11).subType;
    bVar3 = true;
    bVar4 = true;
    do {
      uVar1 = exTypeExtra[uVar6].offset;
      TVar2 = exTypes[exTypeExtra[uVar6].type].type;
      if (TVar2 == TYPE_SHORT) {
        bVar7 = (uVar1 & 1) == 0;
LAB_0024bf4d:
        bVar4 = bVar3;
        if (!bVar7) {
          bVar3 = false;
          bVar4 = false;
        }
      }
      else {
        if (TVar2 == TYPE_LONG) {
          bVar7 = (uVar1 & 7) == 0;
          goto LAB_0024bf4d;
        }
        if (TVar2 == TYPE_INT) {
          bVar7 = (uVar1 & 3) == 0;
          goto LAB_0024bf4d;
        }
      }
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return bVar4;
}

Assistant:

bool AreMembersAligned(ExternTypeInfo *lType, ExternTypeInfo *exTypes, ExternMemberInfo *exTypeExtra)
{
	bool aligned = 1;
	for(unsigned m = 0; m < lType->memberCount; m++)
	{
		ExternMemberInfo &member = exTypeExtra[lType->memberOffset + m];
		ExternTypeInfo &memberType = exTypes[member.type];
		unsigned pos = member.offset;

		switch(memberType.type)
		{
		case ExternTypeInfo::TYPE_COMPLEX:
			break;
		case ExternTypeInfo::TYPE_VOID:
			break;
		case ExternTypeInfo::TYPE_INT:
			if(pos % 4 != 0)
				aligned = 0;
			break;
		case ExternTypeInfo::TYPE_FLOAT:
			break;
		case ExternTypeInfo::TYPE_LONG:
			if(pos % 8 != 0)
				aligned = 0;
			break;
		case ExternTypeInfo::TYPE_DOUBLE:
			break;
		case ExternTypeInfo::TYPE_SHORT:
			if(pos % 2 != 0)
				aligned = 0;
			break;
		case ExternTypeInfo::TYPE_CHAR:
			break;
		}
		pos += memberType.size;
	}
	//printf("%s\n", aligned ? "aligned" : "unaligned");
	return aligned;
}